

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mark_begin_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::mark_begin_matcher::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (mark_begin_matcher *this,
          match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *state,matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *next)

{
  int iVar1;
  sub_match_impl *psVar2;
  char *pcVar3;
  int iVar4;
  
  iVar1 = this->mark_number_;
  psVar2 = state->sub_matches_;
  pcVar3 = psVar2[iVar1].begin_._M_current;
  psVar2[iVar1].begin_._M_current = (state->cur_)._M_current;
  iVar4 = (*(next->
            super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._vptr_matchable[2])(next);
  if (SUB41(iVar4,0) == false) {
    psVar2[iVar1].begin_._M_current = pcVar3;
  }
  return SUB41(iVar4,0);
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            sub_match_impl<BidiIter> &br = state.sub_match(this->mark_number_);

            BidiIter old_begin = br.begin_;
            br.begin_ = state.cur_;

            if(next.match(state))
            {
                return true;
            }

            br.begin_ = old_begin;
            return false;
        }